

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O0

void cmCMakePresetsErrors::INVALID_ROOT(Value *value,cmJSONState *state)

{
  allocator<char> local_39;
  string local_38;
  cmJSONState *local_18;
  cmJSONState *state_local;
  Value *value_local;
  
  local_18 = state;
  state_local = (cmJSONState *)value;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Invalid root object",&local_39);
  cmJSONState::AddErrorAtValue(state,&local_38,(Value *)state_local);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void INVALID_ROOT(const Json::Value* value, cmJSONState* state)
{
  state->AddErrorAtValue("Invalid root object", value);
}